

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

int GetArgs(char *name)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  bool bVar4;
  char local_a8 [8];
  char currarg [128];
  int instring;
  int narg;
  char *t;
  char *s;
  char *name_local;
  
  sVar2 = strlen(name);
  currarg._124_4_ = (int)sVar2 + 1;
  Heap2Space(currarg._124_4_);
  strcpy(NextFNS,name);
  NextFNS = NextFNS + (int)currarg._124_4_;
  if (High2 < NextFNS) {
    High2 = NextFNS;
  }
  currarg[0x7c] = '\0';
  currarg[0x7d] = '\0';
  currarg[0x7e] = '\0';
  currarg[0x7f] = '\0';
  t = Line + SrcLoc;
  do {
    ppuVar3 = __ctype_b_loc();
    bVar4 = false;
    if ((((*ppuVar3)[(int)*t] & 0x2000) == 0) && (bVar4 = false, *t != ';')) {
      bVar4 = *t != '\0';
    }
    if (!bVar4) {
      iVar1._0_1_ = currarg[0x7c];
      iVar1._1_1_ = currarg[0x7d];
      iVar1._2_1_ = currarg[0x7e];
      iVar1._3_1_ = currarg[0x7f];
      return iVar1;
    }
    _instring = local_a8;
    currarg._120_4_ = ZEXT14(*t == '<');
    if (*t == '<') {
      t = t + 1;
    }
    while (*t != '\0') {
      if (currarg._120_4_ == 0) {
        if (((*t == ',') || (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*t] & 0x2000) != 0)) ||
           (*t == ';')) break;
      }
      else if (*t == '>') {
        t = t + 1;
        break;
      }
      *_instring = *t;
      _instring = _instring + 1;
      t = t + 1;
    }
    *_instring = '\0';
    Heap2Space((int)(_instring + 1) - (int)local_a8);
    strcpy(NextFNS,local_a8);
    NextFNS = NextFNS + ((long)(_instring + 1) - (long)local_a8);
    if (High2 < NextFNS) {
      High2 = NextFNS;
    }
    currarg._124_4_ = currarg._124_4_ + 1;
    if (*t == ',') {
      t = t + 1;
    }
  } while( true );
}

Assistant:

int 
GetArgs (char *name)
/* Gets macro arguments and adds them to FNStack after adding "name".
 Returns the number of arguments added to the stack.
 Note that this might not be the full number of arguments
 provided if the stack overflowed.				*/
{
	register char *s, *t;
	int narg, instring;
	char currarg[MAXLINE]; /* Current argument */

	narg = strlen(name) + 1;
	Heap2Space(narg); /* Find space for name. */
	strcpy(NextFNS, name); /* Add name to stack. */
	NextFNS += narg; /* Bump pointer. */
	if (NextFNS > High2)
		High2 = NextFNS; /* Update the high-water mark. */

	narg = 0; /* Argument counter */

	s = Line + SrcLoc; /* Now scan Line. */
	while (!isspace(*s) && (*s != ';') && (*s != '\0')) {
		t = currarg;
		if ((instring = (*s == '<'))) /* String delimiter */
			s++;
		//TODO: Maybe introduce a newinstring = (*s == '"') and go for it?
		while (1) {
			if (*s == '\0')
				break; /* End of line */
			if (instring) {
				if (*s == '>') {
					s++;
					break; /* End of string */
				}
			} else {
				if ((*s == ',') /* End of operand */
				|| isspace(*s) /* End of all operands */
				|| (*s == ';')) /* Start of comments */
					break;
			}
			*t++ = *s++; /* Get a character. */
		}
		*t++ = '\0';
		Heap2Space(t - currarg); /* Check for space. */
		strcpy(NextFNS, currarg); /* Store argument. */
		NextFNS += t - currarg; /* Next available space */
		if (NextFNS > High2)
			High2 = NextFNS; /* High-water mark */
		narg++; /* Count arguments. */
		if (*s == ',')
			s++; /* Skip over separator. */
	}
	return (narg); /* Successful completion */
}